

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O1

void VP8LoadFinalBytes(VP8BitReader *br)

{
  byte *pbVar1;
  
  pbVar1 = br->buf;
  if (pbVar1 < br->buf_end) {
    br->bits = br->bits + 8;
    br->buf = pbVar1 + 1;
    br->value = br->value << 8 | (ulong)*pbVar1;
    return;
  }
  if (br->eof != 0) {
    br->bits = 0;
    return;
  }
  br->value = br->value << 8;
  br->bits = br->bits + 8;
  br->eof = 1;
  return;
}

Assistant:

void VP8LoadFinalBytes(VP8BitReader* const br) {
  assert(br != NULL && br->buf != NULL);
  // Only read 8bits at a time
  if (br->buf < br->buf_end) {
    br->bits += 8;
    br->value = (bit_t)(*br->buf++) | (br->value << 8);
  } else if (!br->eof) {
    br->value <<= 8;
    br->bits += 8;
    br->eof = 1;
  } else {
    br->bits = 0;  // This is to avoid undefined behaviour with shifts.
  }
}